

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingTest::init(VaryingTest *this,EVP_PKEY_CTX *ctx)

{
  VertexVaryingShader *pVVar1;
  int iVar2;
  ShaderProgramDeclaration *pSVar3;
  ostream *poVar4;
  int i;
  int iVar5;
  char *pcVar6;
  int vertexNdx;
  int iVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  ostringstream vertexSource;
  ostringstream geometrySource;
  ostringstream fragmentSource;
  ContextType local_6f4;
  ulong local_6f0;
  VertexVaryingShader *local_6e8;
  VertexAttribute local_6e0;
  VaryingTest *local_6b8;
  FragmentSource local_6b0;
  string local_690;
  VertexAttribute local_670;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  GeometrySource local_5c8;
  ShaderProgramDeclaration local_5a8;
  ostream local_498;
  ostream local_320;
  ostream local_1a8;
  
  local_6e8 = (VertexVaryingShader *)operator_new(0x160);
  local_6f4.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar2 = this->m_vertexOut;
  local_6f0 = (ulong)(uint)this->m_geometryOut;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_5a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"a_position",(allocator<char> *)&local_628);
  local_6b8 = this;
  std::__cxx11::string::string((string *)&local_6e0,(string *)&local_690);
  local_6e0.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_5a8,&local_6e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"a_color",(allocator<char> *)&local_648);
  std::__cxx11::string::string((string *)&local_670,(string *)&local_6b0);
  local_670.type = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_690);
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  iVar7 = iVar5;
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    local_6e0.name._M_dataplus._M_p = local_6e0.name._M_dataplus._M_p & 0xffffff0000000000;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              (&local_5a8,(VertexToGeometryVarying *)&local_6e0);
  }
  iVar7 = 0;
  if (0 < (int)local_6f0) {
    iVar7 = (int)local_6f0;
  }
  iVar9 = iVar7;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    local_6e0.name._M_dataplus._M_p = local_6e0.name._M_dataplus._M_p & 0xffffff0000000000;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              (&local_5a8,(GeometryToFragmentVarying *)&local_6e0);
  }
  local_670.name._M_dataplus._M_p._0_4_ = 0;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_5a8,(FragmentOutput *)&local_670)
  ;
  local_6e0.name._M_dataplus._M_p = (pointer)0x200000003;
  local_6e0.name._M_string_length = 3;
  local_6e0.name.field_2._M_allocated_capacity = 1;
  sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,(GeometryShaderDeclaration *)&local_6e0);
  std::operator<<(&local_498,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\n");
  if (iVar2 == -1) {
    pcVar6 = "void main (void)\n{\n}\n";
  }
  else {
    for (iVar9 = 0; iVar5 != iVar9; iVar9 = iVar9 + 1) {
      poVar4 = std::operator<<(&local_498,"out highp vec4 v_geom_");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
      std::operator<<(poVar4,";\n");
    }
    std::operator<<(&local_498,
                    "void main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n");
    pcVar6 = "}\n";
    if (iVar2 == 1) {
      pcVar8 = "\tv_geom_0 = a_color;\n";
    }
    else {
      if (iVar2 != 2) goto LAB_011f4950;
      std::operator<<(&local_498,"\tv_geom_0 = a_color * 0.5;\n");
      pcVar8 = "\tv_geom_1 = a_color.zyxw * 0.5;\n";
    }
    std::operator<<(&local_498,pcVar8);
  }
LAB_011f4950:
  std::operator<<(&local_498,pcVar6);
  std::operator<<(&local_1a8,
                  "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\n");
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    poVar4 = std::operator<<(&local_1a8,"in mediump vec4 v_frag_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
    std::operator<<(poVar4,";\n");
  }
  std::operator<<(&local_1a8,"void main (void)\n{\n");
  if ((uint)local_6f0 < 3) {
    std::operator<<(&local_1a8,&DAT_01887c38 + *(int *)(&DAT_01887c38 + local_6f0 * 4));
  }
  std::operator<<(&local_1a8,"}\n");
  std::operator<<(&local_320,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\n"
                 );
  for (iVar9 = 0; iVar5 != iVar9; iVar9 = iVar9 + 1) {
    poVar4 = std::operator<<(&local_320,"in highp vec4 v_geom_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
    std::operator<<(poVar4,"[];\n");
  }
  for (iVar5 = 0; iVar7 != iVar5; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<(&local_320,"out highp vec4 v_frag_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    std::operator<<(poVar4,";\n");
  }
  std::operator<<(&local_320,
                  "void main (void)\n{\n\thighp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n\thighp vec4 inputColor;\n\n"
                 );
  iVar5 = 0;
  do {
    if (iVar5 == 3) {
      std::operator<<(&local_320,"\tEndPrimitive();\n}\n");
      std::__cxx11::stringbuf::str();
      specializeShader(&local_670.name,&local_690,&local_6f4);
      std::__cxx11::string::string((string *)&local_6e0,(string *)&local_670);
      pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<
                         (&local_5a8,(VertexSource *)&local_6e0);
      std::__cxx11::stringbuf::str();
      specializeShader(&local_628,&local_648,&local_6f4);
      std::__cxx11::string::string((string *)&local_6b0,(string *)&local_628);
      pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_6b0);
      std::__cxx11::stringbuf::str();
      specializeShader(&local_5e8,&local_608,&local_6f4);
      std::__cxx11::string::string((string *)&local_5c8,(string *)&local_5e8);
      sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
      pVVar1 = local_6e8;
      pSVar3 = &local_5a8;
      sglr::ShaderProgram::ShaderProgram(&local_6e8->super_ShaderProgram,pSVar3);
      sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_5a8);
      (pVVar1->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
           (_func_int **)&PTR_shadeVertices_01e4f9a0;
      (pVVar1->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
           (_func_int **)&DAT_01e4f9d8;
      (pVVar1->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
           (_func_int **)&DAT_01e4f9f0;
      *(int *)&(pVVar1->super_ShaderProgram).field_0x154 = iVar2;
      pVVar1->m_geometryOut = (int)local_6f0;
      local_6b8->m_program = pVVar1;
      iVar2 = GeometryShaderRenderTest::init
                        (&local_6b8->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar3);
      return iVar2;
    }
    if (iVar2 == -1) {
      poVar4 = std::operator<<(&local_320,
                               "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tgl_Position = vec4(");
      pcVar6 = "1.0, 1.0";
      if (iVar5 == 1) {
        pcVar6 = "1.0, 0.0";
      }
      if (iVar5 == 0) {
        pcVar6 = "0.0, 0.0";
      }
      poVar4 = std::operator<<(poVar4,pcVar6);
      pcVar6 = ", 0.0, 1.0) + offset;\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n";
    }
    else {
      pcVar6 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
      poVar4 = &local_320;
      if (iVar2 == 0) {
LAB_011f4b9e:
        std::operator<<(poVar4,pcVar6);
      }
      else {
        if (iVar2 == 2) {
          poVar4 = std::operator<<(&local_320,"\tinputColor = v_geom_0[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
          poVar4 = std::operator<<(poVar4,"] * 0.5 + v_geom_1[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
          pcVar6 = "].zyxw * 0.5;\n";
          goto LAB_011f4b9e;
        }
        if (iVar2 == 1) {
          poVar4 = std::operator<<(&local_320,"\tinputColor = v_geom_0[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
          pcVar6 = "];\n";
          goto LAB_011f4b9e;
        }
      }
      poVar4 = std::operator<<(&local_320,"\tgl_Position = gl_in[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      pcVar6 = "].gl_Position + offset;\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n";
    }
    std::operator<<(poVar4,pcVar6);
    pcVar6 = "\tv_frag_0 = inputColor;\n";
    if ((uint)local_6f0 == 1) {
LAB_011f4bed:
      std::operator<<(&local_320,pcVar6);
    }
    else if ((uint)local_6f0 == 2) {
      std::operator<<(&local_320,"\tv_frag_0 = inputColor * 0.5;\n");
      pcVar6 = "\tv_frag_1 = inputColor.yxzw * 0.5;\n";
      goto LAB_011f4bed;
    }
    std::operator<<(&local_320,"\tEmitVertex();\n\n");
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void VaryingTest::init (void)
{
	m_program = new VertexVaryingShader(m_context.getRenderContext().getType(), m_vertexOut, m_geometryOut);

	GeometryShaderRenderTest::init();
}